

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list.h
# Opt level: O2

loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>_>
* __thiscall
omp::make_loaded_list<(anonymous_namespace)::IIntegerManager,std::vector<int,std::allocator<int>>>
          (loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>_>
           *__return_storage_ptr__,omp *this,
          shared_ptr<(anonymous_namespace)::IIntegerManager> *list,
          vector<int,_std::allocator<int>_> *args)

{
  undefined8 *puVar1;
  element_type *peVar2;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  puVar1 = *(undefined8 **)this;
  local_38._M_impl.super__Vector_impl_data._M_start =
       (pointer)(list->
                super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
  local_38._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(list->
                super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)list[1].
                super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  (list->super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  (list->super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  list[1].super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (**(code **)*puVar1)();
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  (__return_storage_ptr__->
  super_shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>
  ).list.super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
            (&(__return_storage_ptr__->
              super_shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>
              ).list.
              super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8));
  __return_storage_ptr__->count = 0;
  peVar2 = (__return_storage_ptr__->
           super_shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>
           ).list.
           super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_IIntegerManager[1])(peVar2,&__return_storage_ptr__->count);
  return __return_storage_ptr__;
}

Assistant:

auto make_loaded_list(const std::shared_ptr<T> &list, Args &&...args) {
  using record_by_index = get_record_by_index_<decltype(&T::GetRecordByIndex)>;

  using value_type =
      std::remove_pointer_t<typename record_by_index::value_type>;

  list->LoadDataList(std::forward<Args>(args)...);

  return loaded_list_wrapper<
      shared_ptr_wrapper<T, typename record_by_index::index_type, value_type>>(
      list);
}